

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::setValue(CommonCore *this,InterfaceHandle handle,char *data,uint64_t len)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  pair<helics::route_id,_helics::ActionMessage> *ppVar5;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  char *pcVar6;
  size_t sVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  byte *st1;
  GlobalHandle *target;
  pointer pGVar8;
  string_view message;
  string_view fmt;
  string_view logMessageSource;
  format_args args;
  string_view message_00;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> subs;
  ActionMessage package;
  ActionMessage pub;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> local_278;
  pointer local_260;
  undefined1 local_258 [24];
  uint16_t local_240;
  Time local_238;
  SmallBuffer local_218;
  undefined1 local_1a0 [32];
  Time local_180;
  SmallBuffer local_160;
  ActionMessage local_e8;
  
  ppVar5 = getHandleInfo(this,handle);
  if (ppVar5 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar6 = "Handle not valid (setValue)";
    sVar7 = 0x1b;
  }
  else {
    if ((char)(ppVar5->second).messageID == 'p') {
      if ((((ppVar5->second).messageID & 0x10000000) == 0) &&
         (*(char *)((long)&(ppVar5->second).messageID + 1) == '\x01')) {
        this_00 = getFederateAt(this,(LocalFederateId)(ppVar5->second).messageAction);
        bVar2 = FederateState::checkAndSetValue(this_00,handle,data,len);
        if (bVar2) {
          iVar3 = FederateState::loggingLevel(this_00);
          if (0x11 < iVar3) {
            local_260 = (this_00->name)._M_dataplus._M_p;
            sVar1 = (this_00->name)._M_string_length;
            local_258._0_4_ = (ppVar5->second).source_id.gid;
            local_258._4_4_ = (ppVar5->second).source_handle.hid;
            local_258._8_4_ = (ppVar5->second).dest_id;
            local_258._12_4_ = (ppVar5->second).dest_handle;
            fmt.size_ = 0x4d;
            fmt.data_ = (char *)0x1c;
            args.field_1.args_ = in_R9.args_;
            args.desc_ = (unsigned_long_long)local_258;
            local_258._16_8_ = len;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)local_1a0,(v11 *)"setting value for {} size {}",fmt,args);
            message_00._M_len._4_4_ = local_1a0._12_4_;
            message_00._M_len._0_4_ = local_1a0._8_4_;
            logMessageSource._M_str = local_260;
            logMessageSource._M_len = sVar1;
            message_00._M_str = (char *)local_1a0._0_8_;
            FederateState::logMessage(this_00,0x12,logMessageSource,message_00,false);
            if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
              operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
            }
          }
          FederateState::getSubscribers(&local_278,this_00,handle);
          if (local_278.
              super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_278.
              super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            if ((long)local_278.
                      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_278.
                      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start == 8) {
              ActionMessage::ActionMessage((ActionMessage *)local_258,cmd_pub);
              local_258._12_4_ = handle.hid;
              local_258._8_4_ = (ppVar5->first).rid;
              local_258._16_8_ =
                   *local_278.
                    super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start;
              iVar4 = FederateState::getCurrentIteration(this_00);
              local_240 = (uint16_t)iVar4;
              SmallBuffer::reserve(&local_218,len);
              local_218.bufferSize = len;
              memcpy(local_218.heap,data,len);
              local_238.internalTimeCode = (this_00->allowed_send_time).internalTimeCode;
              gmlc::containers::
              BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
              push<helics::ActionMessage>
                        (&(this->super_BrokerBase).actionQueue,(ActionMessage *)local_258);
            }
            else {
              ActionMessage::ActionMessage((ActionMessage *)local_258,cmd_multi_message);
              local_258._12_4_ = handle.hid;
              local_258._8_4_ = (ppVar5->first).rid;
              ActionMessage::ActionMessage((ActionMessage *)local_1a0,cmd_pub);
              local_1a0._8_4_ = (ppVar5->first).rid;
              local_1a0._12_4_ = handle.hid;
              iVar4 = FederateState::getCurrentIteration(this_00);
              local_1a0._24_2_ = (undefined2)iVar4;
              SmallBuffer::reserve(&local_160,len);
              local_160.bufferSize = len;
              memcpy(local_160.heap,data,len);
              local_180.internalTimeCode = (this_00->allowed_send_time).internalTimeCode;
              if (local_278.
                  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_278.
                  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                pGVar8 = local_278.
                         super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                do {
                  local_1a0._16_8_ = *pGVar8;
                  iVar3 = appendMessage((ActionMessage *)local_258,(ActionMessage *)local_1a0);
                  if (iVar3 < 0) {
                    gmlc::containers::
                    BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
                    ::push<helics::ActionMessage>
                              (&(this->super_BrokerBase).actionQueue,(ActionMessage *)local_258);
                    ActionMessage::ActionMessage(&local_e8,cmd_multi_message);
                    ActionMessage::operator=((ActionMessage *)local_258,&local_e8);
                    ActionMessage::~ActionMessage(&local_e8);
                    local_258._8_4_ = (ppVar5->first).rid;
                    appendMessage((ActionMessage *)local_258,(ActionMessage *)local_1a0);
                  }
                  pGVar8 = pGVar8 + 1;
                } while (pGVar8 != local_278.
                                   super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
              }
              gmlc::containers::
              BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
              push<helics::ActionMessage>
                        (&(this->super_BrokerBase).actionQueue,(ActionMessage *)local_258);
              ActionMessage::~ActionMessage((ActionMessage *)local_1a0);
            }
            ActionMessage::~ActionMessage((ActionMessage *)local_258);
          }
          if (local_278.
              super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_278.
                            super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_278.
                                  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_278.
                                  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      return;
    }
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar6 = "handle does not point to a publication";
    sVar7 = 0x26;
  }
  message._M_str = pcVar6;
  message._M_len = sVar7;
  InvalidIdentifier::InvalidIdentifier(this_01,message);
  __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::setValue(InterfaceHandle handle, const char* data, uint64_t len)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("Handle not valid (setValue)"));
    }
    if (handleInfo->handleType != InterfaceType::PUBLICATION) {
        throw(InvalidIdentifier("handle does not point to a publication"));
    }
    if (checkActionFlag(*handleInfo, disconnected_flag)) {
        return;
    }
    if (!handleInfo->used) {
        return;  // if the value is not required do nothing
    }
    auto* fed = getFederateAt(handleInfo->local_fed_id);
    if (fed->checkAndSetValue(handle, data, len)) {
        if (fed->loggingLevel() >= HELICS_LOG_LEVEL_DATA) {
            fed->logMessage(HELICS_LOG_LEVEL_DATA,
                            fed->getIdentifier(),
                            fmt::format("setting value for {} size {}", handleInfo->key, len));
        }
        auto subs = fed->getSubscribers(handle);
        if (subs.empty()) {
            return;
        }
        if (subs.size() == 1) {
            ActionMessage pub(CMD_PUB);
            pub.source_id = handleInfo->getFederateId();
            pub.source_handle = handle;
            pub.setDestination(subs[0]);
            pub.counter = static_cast<uint16_t>(fed->getCurrentIteration());
            pub.payload.assign(data, len);
            pub.actionTime = fed->nextAllowedSendTime();
            actionQueue.push(std::move(pub));
            return;
        }
        ActionMessage package(CMD_MULTI_MESSAGE);
        package.source_id = handleInfo->getFederateId();
        package.source_handle = handle;

        ActionMessage pub(CMD_PUB);
        pub.source_id = handleInfo->getFederateId();
        pub.source_handle = handle;
        pub.counter = static_cast<uint16_t>(fed->getCurrentIteration());
        pub.payload.assign(data, len);
        pub.actionTime = fed->nextAllowedSendTime();

        for (auto& target : subs) {
            pub.setDestination(target);
            auto res = appendMessage(package, pub);
            if (res < 0)  // deal with max package size if there are a lot of subscribers
            {
                actionQueue.push(std::move(package));
                package = ActionMessage(CMD_MULTI_MESSAGE);
                package.source_id = handleInfo->getFederateId();
                package.source_handle = handle;
                appendMessage(package, pub);
            }
        }
        actionQueue.push(std::move(package));
    }
}